

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O2

bool anon_unknown.dwarf_1bacb1::checkPixels<float>
               (Array2D<unsigned_int> *sampleCount,Array2D<float_*> *ph,int width,int height)

{
  bool bVar1;
  
  bVar1 = checkPixels<float>(sampleCount,ph,0,width + -1,0,height + -1,width);
  return bVar1;
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    return checkPixels<T> (sampleCount, ph, 0, width - 1, 0, height - 1, width);
}